

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_writer.c
# Opt level: O0

void dlep_writer_add_tlv2
               (dlep_writer *writer,uint16_t type,void *data1,uint16_t len1,void *data2,
               uint16_t len2)

{
  autobuf *paVar1;
  uint16_t len2_local;
  void *data2_local;
  uint16_t len1_local;
  void *data1_local;
  uint16_t type_local;
  dlep_writer *writer_local;
  autobuf *local_20;
  uint16_t local_12;
  autobuf *local_10;
  
  paVar1 = writer->out;
  local_12 = htons(type);
  local_10 = paVar1;
  abuf_memcpy(paVar1,&local_12,2);
  paVar1 = writer->out;
  writer_local._6_2_ = htons(len1 + len2);
  local_20 = paVar1;
  abuf_memcpy(paVar1,(void *)((long)&writer_local + 6),2);
  abuf_memcpy(writer->out,data1,(ulong)len1);
  abuf_memcpy(writer->out,data2,(ulong)len2);
  return;
}

Assistant:

void
dlep_writer_add_tlv2(
  struct dlep_writer *writer, uint16_t type, const void *data1, uint16_t len1, const void *data2, uint16_t len2) {
  abuf_append_uint16(writer->out, htons(type));
  abuf_append_uint16(writer->out, htons(len1 + len2));
  abuf_memcpy(writer->out, data1, len1);
  abuf_memcpy(writer->out, data2, len2);
}